

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall AGSMock::MockEngine::free(MockEngine *this,void *__ptr)

{
  IAGSScriptManagedObject *pIVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  byte in_DL;
  _Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false> local_30;
  _Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false> local_28;
  iterator it;
  void *pvStack_18;
  bool force_local;
  void *object_local;
  MockEngine *this_local;
  
  it.super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>.
  _M_cur._7_1_ = in_DL & 1;
  pvStack_18 = __ptr;
  object_local = this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
       ::find(&this->data_->objects,&stack0xffffffffffffffe8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
       ::end(&this->data_->objects);
  bVar2 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar2) {
    if ((it.
         super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
         ._M_cur._7_1_ & 1) == 0) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
               ::operator->((_Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
                             *)&local_28);
      iVar3 = (ppVar4->second).count + -1;
      (ppVar4->second).count = iVar3;
      if (0 < iVar3) {
        return;
      }
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
             ::operator->((_Node_iterator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false,_false>
                           *)&local_28);
    pIVar1 = (ppVar4->second).callback;
    iVar3 = (*(code *)**(undefined8 **)pIVar1)
                      (pIVar1,pvStack_18,
                       (it.
                        super__Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false>
                        ._M_cur._7_1_ & 1) != 0);
    if (iVar3 != 0) {
      std::
      unordered_map<void_*,_AGSMock::MockEngine::Data::Resource,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>_>
      ::erase(&this->data_->objects,(iterator)local_28._M_cur);
    }
  }
  return;
}

Assistant:

void MockEngine::free(void *object, bool force)
{
	decltype(data_->objects)::iterator it = data_->objects.find(object);

	if (it == data_->objects.end())
		return;

	if (!force && --it->second.count > 0)
		return;

	if (!it->second.callback->Dispose((const char *) object, force ? 1 : 0))
		return;

	data_->objects.erase(it);
}